

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaVAttributesComplex(xmlSchemaValidCtxtPtr vctxt)

{
  uint uVar1;
  xmlSchemaTypePtr pxVar2;
  long *plVar3;
  xmlSchemaAttributeUsePtr_conflict pxVar4;
  long lVar5;
  xmlSchemaNodeInfoPtr pxVar6;
  xmlSchemaElementPtr pxVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  xmlSchemaAttrInfoPtr pxVar11;
  xmlSchemaAttributePtr_conflict pxVar12;
  xmlSchemaAttributePtr *ppxVar13;
  xmlSchemaValPtr pxVar14;
  xmlSchemaTypePtr pxVar15;
  xmlNsPtr pxVar16;
  xmlAttrPtr pxVar17;
  xmlGenericErrorFunc *pp_Var18;
  void **ppvVar19;
  xmlChar *in_RCX;
  xmlChar *pxVar20;
  xmlSchemaTypePtr pxVar21;
  xmlSchemaTypePtr node;
  char *pcVar22;
  xmlSchemaIDCStateObjPtr_conflict sto;
  xmlGenericErrorFunc p_Var23;
  xmlSchemaIDCStateObjPtr_conflict pxVar24;
  long lVar25;
  xmlParserErrors xVar26;
  xmlNodePtr node_00;
  xmlSchemaAttributePtr pxVar27;
  void *pvVar28;
  xmlSchemaValidCtxtPtr pxVar29;
  ulong uVar30;
  long lVar31;
  xmlChar *pxVar32;
  _xmlSchemaType *node_01;
  bool bVar33;
  xmlChar prefix [12];
  xmlSchemaPSVIIDCBindingPtr_conflict str2;
  xmlChar *local_40 [2];
  
  pxVar2 = vctxt->inode->typeDef;
  plVar3 = (long *)pxVar2->attrUses;
  uVar1 = vctxt->nbAttrInfos;
  uVar9 = uVar1;
  if ((plVar3 != (long *)0x0) &&
     (pxVar20 = (xmlChar *)(long)(int)plVar3[1], in_RCX = pxVar20, 0 < (long)pxVar20)) {
    pxVar32 = (xmlChar *)0x0;
    do {
      pxVar4 = *(xmlSchemaAttributeUsePtr_conflict *)(*plVar3 + (long)pxVar32 * 8);
      pxVar27 = pxVar4->attrDecl;
      if (0 < (int)uVar1) {
        uVar30 = 0;
        do {
          pxVar11 = vctxt->attrInfos[uVar30];
          if (pxVar11->metaType == 0) {
            if (((*pxVar11->localName == *pxVar27->name) &&
                (iVar8 = xmlStrEqual(pxVar11->localName,pxVar27->name), iVar8 != 0)) &&
               (iVar8 = xmlStrEqual(pxVar11->nsName,pxVar27->targetNamespace), iVar8 != 0)) {
              pxVar11->state = 2;
              pxVar11->use = pxVar4;
              pxVar11->decl = pxVar27;
              pxVar11->typeDef = pxVar27->subtypes;
              goto LAB_001cb96c;
            }
          }
          uVar30 = uVar30 + 1;
        } while (uVar1 != uVar30);
      }
      pxVar29 = vctxt;
      if (pxVar4->occurs == 2) {
        if ((pxVar4->defValue != (xmlChar *)0x0) || (pxVar27->defValue != (xmlChar *)0x0)) {
          pxVar11 = xmlSchemaGetFreshAttrInfo(vctxt);
          if (pxVar11 == (xmlSchemaAttrInfoPtr)0x0) goto LAB_001cbfda;
          pxVar11->state = 8;
          pxVar11->use = pxVar4;
          pxVar11->decl = pxVar27;
          pxVar11->typeDef = pxVar27->subtypes;
          pxVar11->localName = pxVar27->name;
          in_RCX = pxVar27->targetNamespace;
          pxVar11->nsName = in_RCX;
        }
      }
      else if (pxVar4->occurs == 1) {
        pxVar11 = xmlSchemaGetFreshAttrInfo(vctxt);
        if (pxVar11 == (xmlSchemaAttrInfoPtr)0x0) {
LAB_001cbfda:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                     "calling xmlSchemaGetFreshAttrInfo()",(xmlChar *)0x0,(xmlChar *)pxVar29);
          return -1;
        }
        pxVar11->state = 4;
        pxVar11->use = pxVar4;
        pxVar11->decl = pxVar27;
      }
LAB_001cb96c:
      pxVar32 = pxVar32 + 1;
    } while (pxVar32 != pxVar20);
    uVar9 = vctxt->nbAttrInfos;
  }
  if (uVar9 != 0) {
    bVar33 = pxVar2->attributeWildcard != (xmlSchemaWildcardPtr)0x0;
    node = (xmlSchemaTypePtr)CONCAT71((int7)((ulong)in_RCX >> 8),bVar33);
    if (0 < (int)uVar1 && bVar33) {
      uVar30 = 0;
      bVar33 = false;
      do {
        pxVar11 = vctxt->attrInfos[uVar30];
        if ((pxVar11->state == 1) &&
           (iVar8 = xmlSchemaCheckCVCWildcardNamespace(pxVar2->attributeWildcard,pxVar11->nsName),
           iVar8 == 0)) {
          if (pxVar2->attributeWildcard->processContents == 1) {
            pxVar11->state = 0xd;
          }
          else {
            pxVar20 = pxVar11->localName;
            pxVar12 = xmlSchemaGetAttributeDecl(vctxt->schema,pxVar20,pxVar11->nsName);
            pxVar11->decl = pxVar12;
            if (pxVar12 == (xmlSchemaAttributePtr_conflict)0x0) {
              if (pxVar2->attributeWildcard->processContents == 2) {
                pxVar11->state = 0xe;
              }
              else {
                pxVar11->state = 10;
              }
            }
            else {
              pxVar11->state = 2;
              pxVar21 = pxVar12->subtypes;
              pxVar11->typeDef = pxVar21;
              iVar8 = xmlSchemaIsDerivedFromBuiltInType(pxVar21,(int)pxVar20);
              if (iVar8 != 0) {
                if (bVar33) {
                  pxVar11->state = 0xf;
                  pp_Var18 = __xmlGenericError();
                  p_Var23 = *pp_Var18;
                  ppvVar19 = __xmlGenericErrorContext();
                  node = (xmlSchemaTypePtr)0x641e;
                  (*p_Var23)(*ppvVar19,"Unimplemented block at %s:%d\n",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                            );
                  bVar33 = true;
                }
                else {
                  bVar33 = true;
                  if (plVar3 != (long *)0x0) {
                    lVar25 = plVar3[1];
                    if (0 < (long)(int)lVar25) {
                      lVar5 = *plVar3;
                      lVar31 = 0;
                      do {
                        iVar8 = xmlSchemaIsDerivedFromBuiltInType
                                          (*(xmlSchemaTypePtr *)
                                            (*(long *)(*(long *)(lVar5 + lVar31 * 8) + 0x18) + 0x60)
                                           ,(int)pxVar20);
                        if (iVar8 != 0) {
                          pxVar11->state = 0x10;
                          pp_Var18 = __xmlGenericError();
                          p_Var23 = *pp_Var18;
                          ppvVar19 = __xmlGenericErrorContext();
                          node = (xmlSchemaTypePtr)0x6430;
                          (*p_Var23)(*ppvVar19,"Unimplemented block at %s:%d\n",
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                                    );
                          break;
                        }
                        lVar31 = lVar31 + 1;
                      } while ((int)lVar25 != lVar31);
                    }
                    bVar33 = true;
                  }
                }
              }
            }
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar1);
      uVar9 = vctxt->nbAttrInfos;
      if (uVar9 == 0) {
        return 0;
      }
    }
    if ((((vctxt->options & 1) == 0) ||
        (node = (xmlSchemaTypePtr)vctxt->elemInfos[vctxt->depth], node == (xmlSchemaTypePtr)0x0)) ||
       (node_01 = node->next, node_01 == (_xmlSchemaType *)0x0)) {
      node_01 = (_xmlSchemaType *)0x0;
    }
    else {
      node = (xmlSchemaTypePtr)node_01->attributes;
      if (node == (xmlSchemaTypePtr)0x0) {
        node_01 = (_xmlSchemaType *)0x0;
      }
    }
    if (0 < (int)uVar9) {
      lVar25 = 0;
      do {
        pxVar6 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar25];
        iVar8 = pxVar6->depth;
        if ((iVar8 == 8) || (iVar8 == 2)) {
          if (pxVar6->typeDef != (xmlSchemaTypePtr)0x0) {
            vctxt->inode = pxVar6;
            pxVar29 = vctxt;
            if (vctxt->xpathStates == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
              iVar10 = 0;
LAB_001cbc43:
              if (iVar8 != 8) {
                if (vctxt->value != (xmlSchemaValPtr)0x0) {
                  xmlSchemaFreeValue(vctxt->value);
                  vctxt->value = (xmlSchemaValPtr)0x0;
                }
                bVar33 = true;
                if (((((*(xmlSchemaAttributePtr *)&pxVar6->normVal)->flags & 0x200) == 0) &&
                    ((pxVar6->decl == (xmlSchemaElementPtr)0x0 ||
                     (((ulong)pxVar6->decl->ref & 0x200) == 0)))) && (bVar33 = false, iVar10 == 0))
                {
                  pxVar21 = pxVar6->typeDef;
                  node_00 = pxVar6->node;
                  node = (xmlSchemaTypePtr)pxVar6->value;
                  iVar8 = 0;
                  pxVar29 = (xmlSchemaValidCtxtPtr)0x0;
                }
                else {
                  *(byte *)&pxVar6->flags = (byte)pxVar6->flags | 0x10;
                  pxVar21 = pxVar6->typeDef;
                  node_00 = pxVar6->node;
                  node = (xmlSchemaTypePtr)pxVar6->value;
                  pxVar29 = (xmlSchemaValidCtxtPtr)&pxVar6->val;
                  iVar8 = 1;
                }
                iVar8 = xmlSchemaVCheckCVCSimpleType
                                  ((xmlSchemaAbstractCtxtPtr)vctxt,node_00,pxVar21,(xmlChar *)node,
                                   (xmlSchemaValPtr *)pxVar29,1,iVar8,0);
                if (iVar8 == 0) {
                  if (bVar33) {
                    if (pxVar6->val == (xmlSchemaValPtr)0x0) {
                      pp_Var18 = __xmlGenericError();
                      p_Var23 = *pp_Var18;
                      ppvVar19 = __xmlGenericErrorContext();
                      pvVar28 = *ppvVar19;
                      node = (xmlSchemaTypePtr)0x652e;
LAB_001cbf78:
                      (*p_Var23)(pvVar28,"Unimplemented block at %s:%d\n",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                                );
                    }
                    else {
                      pxVar7 = pxVar6->decl;
                      if ((pxVar7 == (xmlSchemaElementPtr)0x0) ||
                         (node = pxVar7->subtypes, node == (xmlSchemaTypePtr)0x0)) {
                        pxVar27 = (xmlSchemaAttributePtr)
                                  (*(xmlSchemaAttributePtr *)&pxVar6->normVal)->defVal;
                        if (pxVar27 == (xmlSchemaAttributePtr)0x0) {
                          pp_Var18 = __xmlGenericError();
                          p_Var23 = *pp_Var18;
                          ppvVar19 = __xmlGenericErrorContext();
                          pvVar28 = *ppvVar19;
                          node = (xmlSchemaTypePtr)0x6544;
                          goto LAB_001cbf78;
                        }
                        pxVar6->idcTable =
                             (xmlSchemaPSVIIDCBindingPtr_conflict)
                             (*(xmlSchemaAttributePtr *)&pxVar6->normVal)->defValue;
                      }
                      else {
                        pxVar27 = pxVar7->attributes;
                        if (pxVar27 == (xmlSchemaAttributePtr)0x0) {
                          pp_Var18 = __xmlGenericError();
                          p_Var23 = *pp_Var18;
                          ppvVar19 = __xmlGenericErrorContext();
                          pvVar28 = *ppvVar19;
                          node = (xmlSchemaTypePtr)0x6535;
                          goto LAB_001cbf78;
                        }
                        pxVar6->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)node;
                      }
                      iVar8 = xmlSchemaAreValuesEqual(pxVar6->val,(xmlSchemaValPtr)pxVar27);
                      if (iVar8 == 0) {
                        pxVar6->depth = 7;
                      }
                    }
                  }
                }
                else {
                  if (iVar8 == -1) {
                    pcVar22 = "calling xmlSchemaStreamValidateSimpleTypeValue()";
                    goto LAB_001cc20e;
                  }
                  pxVar6->depth = 5;
                }
LAB_001cbf81:
                if (iVar10 == 0) {
LAB_001cbfba:
                  pxVar24 = vctxt->xpathStates;
                  while ((pxVar24 != (xmlSchemaIDCStateObjPtr_conflict)0x0 &&
                         (iVar8 = xmlStreamPop((xmlStreamCtxtPtr)pxVar24->xpathCtxt), iVar8 != -1)))
                  {
                    pxVar24 = pxVar24->next;
                  }
                  goto LAB_001cbfa0;
                }
                iVar8 = xmlSchemaXPathProcessHistory(vctxt,vctxt->depth + 1);
                if (iVar8 != -1) goto LAB_001cbfa0;
                goto LAB_001cc1a2;
              }
              node = (xmlSchemaTypePtr)CONCAT71((int7)((ulong)node >> 8),iVar10 == 0);
              if (node_01 == (_xmlSchemaType *)0x0 && iVar10 == 0) goto LAB_001cbfba;
              node = pxVar6->decl->subtypes;
              if (node == (xmlSchemaTypePtr)0x0) {
                node = (xmlSchemaTypePtr)(*(xmlSchemaAttributePtr *)&pxVar6->normVal)->defValue;
                ppxVar13 = (xmlSchemaAttributePtr *)
                           &(*(xmlSchemaAttributePtr *)&pxVar6->normVal)->defVal;
              }
              else {
                ppxVar13 = &pxVar6->decl->attributes;
              }
              pxVar27 = *ppxVar13;
              pxVar6->value = (xmlChar *)node;
              pxVar6->val = (xmlSchemaValPtr)pxVar27;
              if (pxVar27 == (xmlSchemaAttributePtr)0x0) {
                pcVar22 = "default/fixed value on an attribute use was not precomputed";
LAB_001cc20e:
                xmlSchemaInternalErr2
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar22,
                           (xmlChar *)0x0,(xmlChar *)pxVar29);
                goto LAB_001cc21d;
              }
              pxVar14 = xmlSchemaCopyValue((xmlSchemaValPtr)pxVar27);
              pxVar6->val = pxVar14;
              if (pxVar14 != (xmlSchemaValPtr)0x0) {
                if (node_01 != (_xmlSchemaType *)0x0) {
                  pxVar21 = (xmlSchemaTypePtr)pxVar6->value;
                  pxVar15 = (xmlSchemaTypePtr)
                            xmlSchemaNormalizeValue(pxVar6->typeDef,(xmlChar *)pxVar21);
                  if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                    pxVar21 = pxVar15;
                  }
                  if (pxVar6->nsName == (xmlChar *)0x0) {
                    pxVar17 = xmlNewProp((xmlNodePtr)node_01,pxVar6->localName,(xmlChar *)pxVar21);
                    if (pxVar17 == (xmlAttrPtr)0x0) {
                      xmlSchemaInternalErr2
                                ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                                 "calling xmlNewProp()",(xmlChar *)0x0,(xmlChar *)pxVar29);
                      if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                        (*xmlFree)(pxVar15);
                      }
                      goto LAB_001cc21d;
                    }
                  }
                  else {
                    pxVar16 = xmlSearchNsByHref((xmlDocPtr)node_01->attributes,(xmlNodePtr)node_01,
                                                pxVar6->nsName);
                    if (pxVar16 == (xmlNsPtr)0x0) {
                      iVar8 = 0;
                      do {
                        snprintf((char *)local_40,0xc,"p%d");
                        pxVar16 = xmlSearchNs((xmlDocPtr)node_01->attributes,(xmlNodePtr)node_01,
                                              (xmlChar *)local_40);
                        if (iVar8 == 1000) {
                          xmlSchemaInternalErr2
                                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                                     "could not compute a ns prefix for a default/fixed attribute",
                                     (xmlChar *)0x0,(xmlChar *)pxVar29);
                          if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                            (*xmlFree)(pxVar15);
                          }
                          goto LAB_001cc21d;
                        }
                        iVar8 = iVar8 + 1;
                      } while (pxVar16 != (xmlNsPtr)0x0);
                      pxVar16 = xmlNewNs(vctxt->validationRoot,pxVar6->nsName,(xmlChar *)local_40);
                    }
                    xmlNewNsProp((xmlNodePtr)node_01,pxVar16,pxVar6->localName,(xmlChar *)pxVar21);
                    node = pxVar21;
                  }
                  if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                    (*xmlFree)(pxVar15);
                  }
                }
                goto LAB_001cbf81;
              }
              pcVar22 = "calling xmlSchemaCopyValue()";
            }
            else {
              iVar10 = xmlSchemaXPathEvaluate(vctxt,XML_ATTRIBUTE_NODE);
              if (iVar10 != -1) {
                iVar8 = pxVar6->depth;
                goto LAB_001cbc43;
              }
LAB_001cc1a2:
              pcVar22 = "calling xmlSchemaXPathEvaluate()";
            }
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar22,
                       (xmlChar *)0x0,(xmlChar *)pxVar29);
LAB_001cc21d:
            vctxt->inode = vctxt->elemInfos[vctxt->depth];
            return -1;
          }
          pxVar6->depth = 6;
        }
LAB_001cbfa0:
        lVar25 = lVar25 + 1;
      } while (lVar25 < vctxt->nbAttrInfos);
      if (0 < vctxt->nbAttrInfos) {
        lVar25 = 0;
        do {
          pxVar6 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar25];
          uVar1 = pxVar6->depth;
          if ((uVar1 < 0x12) && ((0x26004U >> (uVar1 & 0x1f) & 1) != 0))
          goto switchD_001cc058_caseD_2;
          vctxt->inode = pxVar6;
          switch(uVar1) {
          case 1:
            if (*(int *)&pxVar6->field_0x5c == 0) {
              if (pxVar2->attributeWildcard == (xmlSchemaWildcardPtr)0x0) {
                xVar26 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1;
              }
              else {
                xVar26 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2;
              }
              xmlSchemaIllegalAttrErr
                        ((xmlSchemaAbstractCtxtPtr)vctxt,xVar26,(xmlSchemaAttrInfoPtr)pxVar6,
                         (xmlNodePtr)node);
            }
            break;
          case 4:
            local_40[0] = (xmlChar *)0x0;
            vctxt->inode = vctxt->elemInfos[vctxt->depth];
            pxVar20 = xmlSchemaFormatQName
                                (local_40,(*(xmlSchemaAttributePtr *)&pxVar6->normVal)->
                                          targetNamespace,
                                 (*(xmlSchemaAttributePtr *)&pxVar6->normVal)->name);
            node = (xmlSchemaTypePtr)0x0;
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_4,
                                (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                                "The attribute \'%s\' is required but missing",pxVar20,
                                (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            if (local_40[0] != (xmlChar *)0x0) {
              (*xmlFree)(local_40[0]);
            }
            break;
          case 6:
            xVar26 = XML_SCHEMAV_CVC_ATTRIBUTE_2;
            pcVar22 = "The type definition is absent";
            goto LAB_001cc161;
          case 7:
            pxVar20 = pxVar6->value;
            str2 = pxVar6->idcTable;
            xVar26 = XML_SCHEMAV_CVC_AU;
            pcVar22 = "The value \'%s\' does not match the fixed value constraint \'%s\'";
            goto LAB_001cc164;
          case 10:
            xVar26 = XML_SCHEMAV_CVC_WILDCARD;
            pcVar22 = 
            "No matching global attribute declaration available, but demanded by the strict wildcard"
            ;
LAB_001cc161:
            str2 = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
            pxVar20 = (xmlChar *)0x0;
LAB_001cc164:
            node = (xmlSchemaTypePtr)0x0;
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar26,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)0x0,pcVar22,pxVar20,(xmlChar *)str2,
                                (xmlChar *)0x0,(xmlChar *)0x0);
          }
switchD_001cc058_caseD_2:
          lVar25 = lVar25 + 1;
        } while (lVar25 < vctxt->nbAttrInfos);
      }
    }
    vctxt->inode = vctxt->elemInfos[vctxt->depth];
  }
  return 0;
}

Assistant:

static int
xmlSchemaVAttributesComplex(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaTypePtr type = vctxt->inode->typeDef;
    xmlSchemaItemListPtr attrUseList;
    xmlSchemaAttributeUsePtr attrUse = NULL;
    xmlSchemaAttributePtr attrDecl = NULL;
    xmlSchemaAttrInfoPtr iattr, tmpiattr;
    int i, j, found, nbAttrs, nbUses;
    int xpathRes = 0, res, wildIDs = 0, fixed;
    xmlNodePtr defAttrOwnerElem = NULL;

    /*
    * SPEC (cvc-attribute)
    * (1) "The declaration must not be `absent` (see Missing
    * Sub-components ($5.3) for how this can fail to be
    * the case)."
    * (2) "Its {type definition} must not be absent."
    *
    * NOTE (1) + (2): This is not handled here, since we currently do not
    * allow validation against schemas which have missing sub-components.
    *
    * SPEC (cvc-complex-type)
    * (3) "For each attribute information item in the element information
    * item's [attributes] excepting those whose [namespace name] is
    * identical to http://www.w3.org/2001/XMLSchema-instance and whose
    * [local name] is one of type, nil, schemaLocation or
    * noNamespaceSchemaLocation, the appropriate case among the following
    * must be true:
    *
    */
    attrUseList = (xmlSchemaItemListPtr) type->attrUses;
    /*
    * @nbAttrs is the number of attributes present in the instance.
    */
    nbAttrs = vctxt->nbAttrInfos;
    if (attrUseList != NULL)
	nbUses = attrUseList->nbItems;
    else
	nbUses = 0;
    for (i = 0; i < nbUses; i++) {
        found = 0;
	attrUse = attrUseList->items[i];
	attrDecl = WXS_ATTRUSE_DECL(attrUse);
        for (j = 0; j < nbAttrs; j++) {
	    iattr = vctxt->attrInfos[j];
	    /*
	    * SPEC (cvc-complex-type) (3)
	    * Skip meta attributes.
	    */
	    if (iattr->metaType)
		continue;
	    if (iattr->localName[0] != attrDecl->name[0])
		continue;
	    if (!xmlStrEqual(iattr->localName, attrDecl->name))
		continue;
	    if (!xmlStrEqual(iattr->nsName, attrDecl->targetNamespace))
		continue;
	    found = 1;
	    /*
	    * SPEC (cvc-complex-type)
	    * (3.1) "If there is among the {attribute uses} an attribute
	    * use with an {attribute declaration} whose {name} matches
	    * the attribute information item's [local name] and whose
	    * {target namespace} is identical to the attribute information
	    * item's [namespace name] (where an `absent` {target namespace}
	    * is taken to be identical to a [namespace name] with no value),
	    * then the attribute information must be `valid` with respect
	    * to that attribute use as per Attribute Locally Valid (Use)
	    * ($3.5.4). In this case the {attribute declaration} of that
	    * attribute use is the `context-determined declaration` for the
	    * attribute information item with respect to Schema-Validity
	    * Assessment (Attribute) ($3.2.4) and
	    * Assessment Outcome (Attribute) ($3.2.5).
	    */
	    iattr->state = XML_SCHEMAS_ATTR_ASSESSED;
	    iattr->use = attrUse;
	    /*
	    * Context-determined declaration.
	    */
	    iattr->decl = attrDecl;
	    iattr->typeDef = attrDecl->subtypes;
	    break;
	}

	if (found)
	    continue;

	if (attrUse->occurs == XML_SCHEMAS_ATTR_USE_REQUIRED) {
	    /*
	    * Handle non-existent, required attributes.
	    *
	    * SPEC (cvc-complex-type)
	    * (4) "The {attribute declaration} of each attribute use in
	    * the {attribute uses} whose {required} is true matches one
	    * of the attribute information items in the element information
	    * item's [attributes] as per clause 3.1 above."
	    */
	    tmpiattr = xmlSchemaGetFreshAttrInfo(vctxt);
	    if (tmpiattr == NULL) {
		VERROR_INT(
		    "xmlSchemaVAttributesComplex",
		    "calling xmlSchemaGetFreshAttrInfo()");
		return (-1);
	    }
	    tmpiattr->state = XML_SCHEMAS_ATTR_ERR_MISSING;
	    tmpiattr->use = attrUse;
	    tmpiattr->decl = attrDecl;
	} else if ((attrUse->occurs == XML_SCHEMAS_ATTR_USE_OPTIONAL) &&
	    ((attrUse->defValue != NULL) ||
	     (attrDecl->defValue != NULL))) {
	    /*
	    * Handle non-existent, optional, default/fixed attributes.
	    */
	    tmpiattr = xmlSchemaGetFreshAttrInfo(vctxt);
	    if (tmpiattr == NULL) {
		VERROR_INT(
		    "xmlSchemaVAttributesComplex",
		    "calling xmlSchemaGetFreshAttrInfo()");
		return (-1);
	    }
	    tmpiattr->state = XML_SCHEMAS_ATTR_DEFAULT;
	    tmpiattr->use = attrUse;
	    tmpiattr->decl = attrDecl;
	    tmpiattr->typeDef = attrDecl->subtypes;
	    tmpiattr->localName = attrDecl->name;
	    tmpiattr->nsName = attrDecl->targetNamespace;
	}
    }

    if (vctxt->nbAttrInfos == 0)
	return (0);
    /*
    * Validate against the wildcard.
    */
    if (type->attributeWildcard != NULL) {
	/*
	* SPEC (cvc-complex-type)
	* (3.2.1) "There must be an {attribute wildcard}."
	*/
	for (i = 0; i < nbAttrs; i++) {
	    iattr = vctxt->attrInfos[i];
	    /*
	    * SPEC (cvc-complex-type) (3)
	    * Skip meta attributes.
	    */
	    if (iattr->state != XML_SCHEMAS_ATTR_UNKNOWN)
		continue;
	    /*
	    * SPEC (cvc-complex-type)
	    * (3.2.2) "The attribute information item must be `valid` with
	    * respect to it as defined in Item Valid (Wildcard) ($3.10.4)."
	    *
	    * SPEC Item Valid (Wildcard) (cvc-wildcard)
	    * "... its [namespace name] must be `valid` with respect to
	    * the wildcard constraint, as defined in Wildcard allows
	    * Namespace Name ($3.10.4)."
	    */
	    if (xmlSchemaCheckCVCWildcardNamespace(type->attributeWildcard,
		    iattr->nsName) == 0) {
		/*
		* Handle processContents.
		*
		* SPEC (cvc-wildcard):
		* processContents | context-determined declaration:
		* "strict"          "mustFind"
		* "lax"             "none"
		* "skip"            "skip"
		*/
		if (type->attributeWildcard->processContents ==
		    XML_SCHEMAS_ANY_SKIP) {
		     /*
		    * context-determined declaration = "skip"
		    *
		    * SPEC PSVI Assessment Outcome (Attribute)
		    * [validity] = "notKnown"
		    * [validation attempted] = "none"
		    */
		    iattr->state = XML_SCHEMAS_ATTR_WILD_SKIP;
		    continue;
		}
		/*
		* Find an attribute declaration.
		*/
		iattr->decl = xmlSchemaGetAttributeDecl(vctxt->schema,
		    iattr->localName, iattr->nsName);
		if (iattr->decl != NULL) {
		    iattr->state = XML_SCHEMAS_ATTR_ASSESSED;
		    /*
		    * SPEC (cvc-complex-type)
		    * (5) "Let [Definition:]  the wild IDs be the set of
		    * all attribute information item to which clause 3.2
		    * applied and whose `validation` resulted in a
		    * `context-determined declaration` of mustFind or no
		    * `context-determined declaration` at all, and whose
		    * [local name] and [namespace name] resolve (as
		    * defined by QName resolution (Instance) ($3.15.4)) to
		    * an attribute declaration whose {type definition} is
		    * or is derived from ID. Then all of the following
		    * must be true:"
		    */
		    iattr->typeDef = WXS_ATTR_TYPEDEF(iattr->decl);
		    if (xmlSchemaIsDerivedFromBuiltInType(
			iattr->typeDef, XML_SCHEMAS_ID)) {
			/*
			* SPEC (5.1) "There must be no more than one
			* item in `wild IDs`."
			*/
			if (wildIDs != 0) {
			    /* VAL TODO */
			    iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_DUPLICATE_ID;
			    TODO
			    continue;
			}
			wildIDs++;
			/*
			* SPEC (cvc-complex-type)
			* (5.2) "If `wild IDs` is non-empty, there must not
			* be any attribute uses among the {attribute uses}
			* whose {attribute declaration}'s {type definition}
			* is or is derived from ID."
			*/
                        if (attrUseList != NULL) {
                            for (j = 0; j < attrUseList->nbItems; j++) {
                                if (xmlSchemaIsDerivedFromBuiltInType(
                                    WXS_ATTRUSE_TYPEDEF(attrUseList->items[j]),
                                    XML_SCHEMAS_ID)) {
                                    /* URGENT VAL TODO: implement */
                            iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_AND_USE_ID;
                                    TODO
                                    break;
                                }
                            }
                        }
		    }
		} else if (type->attributeWildcard->processContents ==
		    XML_SCHEMAS_ANY_LAX) {
		    iattr->state = XML_SCHEMAS_ATTR_WILD_LAX_NO_DECL;
		    /*
		    * SPEC PSVI Assessment Outcome (Attribute)
		    * [validity] = "notKnown"
		    * [validation attempted] = "none"
		    */
		} else {
		    iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_STRICT_NO_DECL;
		}
	    }
	}
    }

    if (vctxt->nbAttrInfos == 0)
	return (0);

    /*
    * Get the owner element; needed for creation of default attributes.
    * This fixes bug #341337, reported by David Grohmann.
    */
    if (vctxt->options & XML_SCHEMA_VAL_VC_I_CREATE) {
	xmlSchemaNodeInfoPtr ielem = vctxt->elemInfos[vctxt->depth];
	if (ielem && ielem->node && ielem->node->doc)
	    defAttrOwnerElem = ielem->node;
    }
    /*
    * Validate values, create default attributes, evaluate IDCs.
    */
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	iattr = vctxt->attrInfos[i];
	/*
	* VAL TODO: Note that we won't try to resolve IDCs to
	* "lax" and "skip" validated attributes. Check what to
	* do in this case.
	*/
	if ((iattr->state != XML_SCHEMAS_ATTR_ASSESSED) &&
	    (iattr->state != XML_SCHEMAS_ATTR_DEFAULT))
	    continue;
	/*
	* VAL TODO: What to do if the type definition is missing?
	*/
	if (iattr->typeDef == NULL) {
	    iattr->state = XML_SCHEMAS_ATTR_ERR_NO_TYPE;
	    continue;
	}

	ACTIVATE_ATTRIBUTE(iattr);
	fixed = 0;
	xpathRes = 0;

	if (vctxt->xpathStates != NULL) {
	    /*
	    * Evaluate IDCs.
	    */
	    xpathRes = xmlSchemaXPathEvaluate(vctxt,
		XML_ATTRIBUTE_NODE);
	    if (xpathRes == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaXPathEvaluate()");
		goto internal_error;
	    }
	}

	if (iattr->state == XML_SCHEMAS_ATTR_DEFAULT) {
	    /*
	    * Default/fixed attributes.
	    * We need the value only if we need to resolve IDCs or
	    * will create default attributes.
	    */
	    if ((xpathRes) || (defAttrOwnerElem)) {
		if (iattr->use->defValue != NULL) {
		    iattr->value = (xmlChar *) iattr->use->defValue;
		    iattr->val = iattr->use->defVal;
		} else {
		    iattr->value = (xmlChar *) iattr->decl->defValue;
		    iattr->val = iattr->decl->defVal;
		}
		/*
		* IDCs will consume the precomputed default value,
		* so we need to clone it.
		*/
		if (iattr->val == NULL) {
		    VERROR_INT("xmlSchemaVAttributesComplex",
			"default/fixed value on an attribute use was "
			"not precomputed");
		    goto internal_error;
		}
		iattr->val = xmlSchemaCopyValue(iattr->val);
		if (iattr->val == NULL) {
		    VERROR_INT("xmlSchemaVAttributesComplex",
			"calling xmlSchemaCopyValue()");
		    goto internal_error;
		}
	    }
	    /*
	    * PSVI: Add the default attribute to the current element.
	    * VAL TODO: Should we use the *normalized* value? This currently
	    *   uses the *initial* value.
	    */

	    if (defAttrOwnerElem) {
		xmlChar *normValue;
		const xmlChar *value;

		value = iattr->value;
		/*
		* Normalize the value.
		*/
		normValue = xmlSchemaNormalizeValue(iattr->typeDef,
		    iattr->value);
		if (normValue != NULL)
		    value = BAD_CAST normValue;

		if (iattr->nsName == NULL) {
		    if (xmlNewProp(defAttrOwnerElem,
			iattr->localName, value) == NULL) {
			VERROR_INT("xmlSchemaVAttributesComplex",
			    "calling xmlNewProp()");
			if (normValue != NULL)
			    xmlFree(normValue);
			goto internal_error;
		    }
		} else {
		    xmlNsPtr ns;

		    ns = xmlSearchNsByHref(defAttrOwnerElem->doc,
			defAttrOwnerElem, iattr->nsName);
		    if (ns == NULL) {
			xmlChar prefix[12];
			int counter = 0;

			/*
			* Create a namespace declaration on the validation
			* root node if no namespace declaration is in scope.
			*/
			do {
			    snprintf((char *) prefix, 12, "p%d", counter++);
			    ns = xmlSearchNs(defAttrOwnerElem->doc,
				defAttrOwnerElem, BAD_CAST prefix);
			    if (counter > 1000) {
				VERROR_INT(
				    "xmlSchemaVAttributesComplex",
				    "could not compute a ns prefix for a "
				    "default/fixed attribute");
				if (normValue != NULL)
				    xmlFree(normValue);
				goto internal_error;
			    }
			} while (ns != NULL);
			ns = xmlNewNs(vctxt->validationRoot,
			    iattr->nsName, BAD_CAST prefix);
		    }
		    /*
		    * TODO:
		    * http://lists.w3.org/Archives/Public/www-xml-schema-comments/2005JulSep/0406.html
		    * If we have QNames: do we need to ensure there's a
		    * prefix defined for the QName?
		    */
		    xmlNewNsProp(defAttrOwnerElem, ns, iattr->localName, value);
		}
		if (normValue != NULL)
		    xmlFree(normValue);
	    }
	    /*
	    * Go directly to IDC evaluation.
	    */
	    goto eval_idcs;
	}
	/*
	* Validate the value.
	*/
	if (vctxt->value != NULL) {
	    /*
	    * Free last computed value; just for safety reasons.
	    */
	    xmlSchemaFreeValue(vctxt->value);
	    vctxt->value = NULL;
	}
	/*
	* Note that the attribute *use* can be unavailable, if
	* the attribute was a wild attribute.
	*/
	if ((iattr->decl->flags & XML_SCHEMAS_ATTR_FIXED) ||
	    ((iattr->use != NULL) &&
	     (iattr->use->flags & XML_SCHEMAS_ATTR_FIXED)))
	    fixed = 1;
	else
	    fixed = 0;
	/*
	* SPEC (cvc-attribute)
	* (3) "The item's `normalized value` must be locally `valid`
	* with respect to that {type definition} as per
	* String Valid ($3.14.4)."
	*
	* VAL TODO: Do we already have the
	* "normalized attribute value" here?
	*/
	if (xpathRes || fixed) {
	    iattr->flags |= XML_SCHEMA_NODE_INFO_VALUE_NEEDED;
	    /*
	    * Request a computed value.
	    */
	    res = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt,
		iattr->node, iattr->typeDef, iattr->value, &(iattr->val),
		1, 1, 0);
	} else {
	    res = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt,
		iattr->node, iattr->typeDef, iattr->value, NULL,
		1, 0, 0);
	}

	if (res != 0) {
	    if (res == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaStreamValidateSimpleTypeValue()");
		goto internal_error;
	    }
	    iattr->state = XML_SCHEMAS_ATTR_INVALID_VALUE;
	    /*
	    * SPEC PSVI Assessment Outcome (Attribute)
	    * [validity] = "invalid"
	    */
	    goto eval_idcs;
	}

	if (fixed) {
	    /*
	    * SPEC Attribute Locally Valid (Use) (cvc-au)
	    * "For an attribute information item to be `valid`
	    * with respect to an attribute use its *normalized*
	    * value must match the *canonical* lexical
	    * representation of the attribute use's {value
	    * constraint}value, if it is present and fixed."
	    *
	    * VAL TODO: The requirement for the *canonical* value
	    * will be removed in XML Schema 1.1.
	    */
	    /*
	    * SPEC Attribute Locally Valid (cvc-attribute)
	    * (4) "The item's *actual* value must match the *value* of
	    * the {value constraint}, if it is present and fixed."
	    */
	    if (iattr->val == NULL) {
		/* VAL TODO: A value was not precomputed. */
		TODO
		goto eval_idcs;
	    }
	    if ((iattr->use != NULL) &&
		(iattr->use->defValue != NULL)) {
		if (iattr->use->defVal == NULL) {
		    /* VAL TODO: A default value was not precomputed. */
		    TODO
		    goto eval_idcs;
		}
		iattr->vcValue = iattr->use->defValue;
		/*
		if (xmlSchemaCompareValuesWhtsp(attr->val,
		    (xmlSchemaWhitespaceValueType) ws,
		    attr->use->defVal,
		    (xmlSchemaWhitespaceValueType) ws) != 0) {
		*/
		if (! xmlSchemaAreValuesEqual(iattr->val, iattr->use->defVal))
		    iattr->state = XML_SCHEMAS_ATTR_ERR_FIXED_VALUE;
	    } else {
		if (iattr->decl->defVal == NULL) {
		    /* VAL TODO: A default value was not precomputed. */
		    TODO
		    goto eval_idcs;
		}
		iattr->vcValue = iattr->decl->defValue;
		/*
		if (xmlSchemaCompareValuesWhtsp(attr->val,
		    (xmlSchemaWhitespaceValueType) ws,
		    attrDecl->defVal,
		    (xmlSchemaWhitespaceValueType) ws) != 0) {
		*/
		if (! xmlSchemaAreValuesEqual(iattr->val, iattr->decl->defVal))
		    iattr->state = XML_SCHEMAS_ATTR_ERR_FIXED_VALUE;
	    }
	    /*
	    * [validity] = "valid"
	    */
	}
eval_idcs:
	/*
	* Evaluate IDCs.
	*/
	if (xpathRes) {
	    if (xmlSchemaXPathProcessHistory(vctxt,
		vctxt->depth +1) == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaXPathEvaluate()");
		goto internal_error;
	    }
	} else if (vctxt->xpathStates != NULL)
	    xmlSchemaXPathPop(vctxt);
    }

    /*
    * Report errors.
    */
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	iattr = vctxt->attrInfos[i];
	if ((iattr->state == XML_SCHEMAS_ATTR_META) ||
	    (iattr->state == XML_SCHEMAS_ATTR_ASSESSED) ||
	    (iattr->state == XML_SCHEMAS_ATTR_WILD_SKIP) ||
	    (iattr->state == XML_SCHEMAS_ATTR_WILD_LAX_NO_DECL))
	    continue;
	ACTIVATE_ATTRIBUTE(iattr);
	switch (iattr->state) {
	    case XML_SCHEMAS_ATTR_ERR_MISSING: {
		    xmlChar *str = NULL;
		    ACTIVATE_ELEM;
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_4, NULL, NULL,
			"The attribute '%s' is required but missing",
			xmlSchemaFormatQName(&str,
			    iattr->decl->targetNamespace,
			    iattr->decl->name),
			NULL);
		    FREE_AND_NULL(str)
		    break;
		}
	    case XML_SCHEMAS_ATTR_ERR_NO_TYPE:
		VERROR(XML_SCHEMAV_CVC_ATTRIBUTE_2, NULL,
		    "The type definition is absent");
		break;
	    case XML_SCHEMAS_ATTR_ERR_FIXED_VALUE:
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_AU, NULL, NULL,
		    "The value '%s' does not match the fixed "
		    "value constraint '%s'",
		    iattr->value, iattr->vcValue);
		break;
	    case XML_SCHEMAS_ATTR_ERR_WILD_STRICT_NO_DECL:
		VERROR(XML_SCHEMAV_CVC_WILDCARD, NULL,
		    "No matching global attribute declaration available, but "
		    "demanded by the strict wildcard");
		break;
	    case XML_SCHEMAS_ATTR_UNKNOWN:
		if (iattr->metaType)
		    break;
		/*
		* MAYBE VAL TODO: One might report different error messages
		* for the following errors.
		*/
		if (type->attributeWildcard == NULL) {
		    xmlSchemaIllegalAttrErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1, iattr, NULL);
		} else {
		    xmlSchemaIllegalAttrErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2, iattr, NULL);
		}
		break;
	    default:
		break;
	}
    }

    ACTIVATE_ELEM;
    return (0);
internal_error:
    ACTIVATE_ELEM;
    return (-1);
}